

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

void remove_module(MIR_context_t ctx,MIR_module_t_conflict module,int free_module_p)

{
  MIR_item_t_conflict elem;
  MIR_item_t_conflict item;
  int free_module_p_local;
  MIR_module_t_conflict module_local;
  MIR_context_t ctx_local;
  
  while( true ) {
    elem = DLIST_MIR_item_t_head(&module->items);
    if (elem == (MIR_item_t_conflict)0x0) break;
    DLIST_MIR_item_t_remove(&module->items,elem);
    remove_item(ctx,elem);
  }
  if (module->data != (void *)0x0) {
    bitmap_destroy((bitmap_t)module->data);
  }
  if (free_module_p != 0) {
    free(module);
  }
  return;
}

Assistant:

static void remove_module (MIR_context_t ctx, MIR_module_t module, int free_module_p) {
  MIR_item_t item;

  while ((item = DLIST_HEAD (MIR_item_t, module->items)) != NULL) {
    DLIST_REMOVE (MIR_item_t, module->items, item);
    remove_item (ctx, item);
  }
  if (module->data != NULL) bitmap_destroy (module->data);
  if (free_module_p) free (module);
}